

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-close.c
# Opt level: O2

int run_test_shutdown_close_pipe(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&h,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_pipe_connect(&connect_req,&h,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = 1;
      eval_b = (int64_t)connect_cb_called;
      if (eval_b == 1) {
        eval_a = 1;
        eval_b = (int64_t)shutdown_cb_called;
        if (eval_b == 1) {
          eval_a = 1;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            eval_a = 0;
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar2 = 0x6a;
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar3 = "1";
            uVar2 = 0x68;
          }
        }
        else {
          pcVar4 = "shutdown_cb_called";
          pcVar3 = "1";
          uVar2 = 0x67;
        }
      }
      else {
        pcVar4 = "connect_cb_called";
        pcVar3 = "1";
        uVar2 = 0x66;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 100;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x61;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-shutdown-close.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(shutdown_close_pipe) {
  uv_pipe_t h;
  int r;

  r = uv_pipe_init(uv_default_loop(), &h, 0);
  ASSERT_OK(r);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_cb);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}